

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

void __thiscall tcu::ThreadUtil::Thread::run(Thread *this)

{
  pointer ppOVar1;
  Operation *pOVar2;
  int operationNdx;
  long lVar3;
  
  this->m_status = THREADSTATUS_RUNNING;
  std::vector<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>::reserve
            (&this->m_messages,
             (long)(this->m_operations).
                   super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_operations).
                   super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2);
  (*(this->super_Thread)._vptr_Thread[3])(this);
  lVar3 = 0;
  while( true ) {
    ppOVar1 = (this->m_operations).
              super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_operations).
                            super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar1) >> 3) <=
        lVar3) break;
    pOVar2 = ppOVar1[lVar3];
    (*pOVar2->_vptr_Operation[3])(pOVar2,this);
    lVar3 = lVar3 + 1;
  }
  (*(this->super_Thread)._vptr_Thread[4])(this);
  this->m_status = THREADSTATUS_READY;
  return;
}

Assistant:

void Thread::run (void)
{
	m_status = THREADSTATUS_RUNNING;
	bool initOk = false;

	// Reserve at least two messages for each operation
	m_messages.reserve(m_operations.size()*2);
	try
	{
		init();
		initOk = true;
		for (int operationNdx = 0; operationNdx < (int)m_operations.size(); operationNdx++)
			m_operations[operationNdx]->execute(*this);

		deinit();
		m_status =  THREADSTATUS_READY;
	}
	catch (const tcu::NotSupportedError& e)
	{
		newMessage() << "tcu::NotSupportedError '" << e.what() << "'" << Message::End;
		deinit();
		m_status = (initOk ? THREADSTATUS_NOT_SUPPORTED : THREADSTATUS_INIT_FAILED);
	}
	catch (const tcu::Exception& e)
	{
		newMessage() << "tcu::Exception '" << e.what() << "'" << Message::End;
		deinit();
		m_status = (initOk ? THREADSTATUS_FAILED : THREADSTATUS_INIT_FAILED);
	}
	catch (const std::exception& error)
	{
		newMessage() << "std::exception '" << error.what() << "'" << Message::End;
		deinit();
		m_status = (initOk ? THREADSTATUS_FAILED : THREADSTATUS_INIT_FAILED);
	}
	catch (...)
	{
		newMessage() << "Unkown exception" << Message::End;
		deinit();
		m_status = (initOk ? THREADSTATUS_FAILED : THREADSTATUS_INIT_FAILED);
	}
}